

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcTextLiteralWithExtent::IfcTextLiteralWithExtent
          (IfcTextLiteralWithExtent *this)

{
  IfcTextLiteralWithExtent *this_local;
  
  STEP::Object::Object((Object *)&this->field_0xb8,"IfcTextLiteralWithExtent");
  IfcTextLiteral::IfcTextLiteral(&this->super_IfcTextLiteral,&PTR_construction_vtable_24__00f4da08);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcTextLiteralWithExtent,_2UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcTextLiteralWithExtent,_2UL> *)
             &(this->super_IfcTextLiteral).field_0x80,&PTR_construction_vtable_24__00f4da80);
  (this->super_IfcTextLiteral).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0xf4d950;
  *(undefined8 *)&this->field_0xb8 = 0xf4d9f0;
  *(undefined8 *)
   &(this->super_IfcTextLiteral).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0xf4d978;
  *(undefined8 *)
   &(this->super_IfcTextLiteral).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0xf4d9a0;
  *(undefined8 *)&(this->super_IfcTextLiteral).field_0x80 = 0xf4d9c8;
  STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPlanarExtent>::Lazy
            ((Lazy<Assimp::IFC::Schema_2x3::IfcPlanarExtent> *)
             &(this->super_IfcTextLiteral).field_0x90,(LazyObject *)0x0);
  std::__cxx11::string::string((string *)&this->BoxAlignment);
  return;
}

Assistant:

IfcTextLiteralWithExtent() : Object("IfcTextLiteralWithExtent") {}